

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

void __thiscall tcu::DebugOutStreambuf::flushLine(DebugOutStreambuf *this)

{
  allocator<char> local_31;
  char *local_30 [4];
  
  std::__cxx11::stringbuf::str();
  qpPrint(local_30[0]);
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"",&local_31);
  std::__cxx11::stringbuf::str((string *)&this->field_0x48);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void DebugOutStreambuf::flushLine (void)
{
	qpPrint(m_curLine.str().c_str());
	m_curLine.str("");
}